

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O0

void __thiscall
cmWorkerPoolInternal::cmWorkerPoolInternal(cmWorkerPoolInternal *this,cmWorkerPool *pool)

{
  pointer loop;
  unique_ptr<uv_loop_s,_std::default_delete<uv_loop_s>_> local_30 [3];
  cmWorkerPool *local_18;
  cmWorkerPool *pool_local;
  cmWorkerPoolInternal *this_local;
  
  local_18 = pool;
  pool_local = (cmWorkerPool *)this;
  std::unique_ptr<uv_loop_s,std::default_delete<uv_loop_s>>::
  unique_ptr<std::default_delete<uv_loop_s>,void>
            ((unique_ptr<uv_loop_s,std::default_delete<uv_loop_s>> *)this);
  ::cm::uv_async_ptr::uv_async_ptr(&this->UVRequestBegin);
  ::cm::uv_async_ptr::uv_async_ptr(&this->UVRequestEnd);
  std::mutex::mutex(&this->Mutex);
  this->Processing = false;
  this->Aborting = false;
  this->FenceProcessing = false;
  this->WorkersRunning = 0;
  this->WorkersIdle = 0;
  this->JobsProcessing = 0;
  std::
  deque<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
  ::deque(&this->Queue);
  std::condition_variable::condition_variable(&this->Condition);
  std::
  vector<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
  ::vector(&this->Workers);
  this->Pool = local_18;
  uv_disable_stdio_inheritance();
  std::make_unique<uv_loop_s>();
  std::unique_ptr<uv_loop_s,_std::default_delete<uv_loop_s>_>::operator=(&this->UVLoop,local_30);
  std::unique_ptr<uv_loop_s,_std::default_delete<uv_loop_s>_>::~unique_ptr(local_30);
  loop = std::unique_ptr<uv_loop_s,_std::default_delete<uv_loop_s>_>::get(&this->UVLoop);
  uv_loop_init(loop);
  return;
}

Assistant:

cmWorkerPoolInternal::cmWorkerPoolInternal(cmWorkerPool* pool)
  : Pool(pool)
{
  // Initialize libuv loop
  uv_disable_stdio_inheritance();
#ifdef CMAKE_UV_SIGNAL_HACK
  UVHackRAII = cm::make_unique<cmUVSignalHackRAII>();
#endif
  UVLoop = cm::make_unique<uv_loop_t>();
  uv_loop_init(UVLoop.get());
}